

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

common_chat_params *
common_chat_templates_apply_legacy
          (common_chat_templates *tmpls,common_chat_templates_inputs *inputs)

{
  byte bVar1;
  bool bVar2;
  common_log *log;
  size_type sVar3;
  long lVar4;
  long lVar5;
  pointer this;
  undefined8 uVar6;
  llama_chat_message *plVar7;
  char *pcVar8;
  size_type sVar9;
  runtime_error *this_00;
  ulong uVar10;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *in_RDX;
  common_chat_params *in_RDI;
  undefined1 auVar11 [16];
  int32_t res;
  string *src;
  vector<char,_std::allocator<char>_> buf;
  value_type *content_1;
  value_type *msg_1;
  size_t i;
  common_chat_msg_content_part *part;
  const_iterator __end2;
  const_iterator __begin2;
  vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_> *__range2;
  string content;
  common_chat_msg *msg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contents;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> chat;
  int alloc_size;
  common_chat_params *params;
  value_type *in_stack_fffffffffffffd68;
  common_chat_params *in_stack_fffffffffffffd70;
  pointer *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  size_type in_stack_fffffffffffffd88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 force_gbnf;
  json *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  parser_callback_t *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  allocator local_139;
  string local_138 [35];
  undefined1 local_115;
  int local_114;
  string *local_110;
  allocator<char> local_101;
  vector<char,_std::allocator<char>_> local_100;
  undefined8 local_e8;
  undefined8 local_e0;
  reference local_d8;
  const_reference local_d0;
  ulong local_c8;
  reference local_c0;
  common_chat_msg_content_part *local_b8;
  __normal_iterator<const_common_chat_msg_content_part_*,_std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>_>
  local_b0;
  vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_> *local_a8;
  string local_90 [32];
  reference local_70;
  common_chat_msg *local_68;
  __normal_iterator<const_common_chat_msg_*,_std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>_>
  local_60;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> local_38;
  int local_1c;
  vector<common_chat_msg,_std::allocator<common_chat_msg>_> *local_18;
  
  local_1c = 0;
  local_18 = in_RDX;
  std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::vector
            ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)0x24608a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x246097);
  local_58 = local_18;
  local_60._M_current =
       (common_chat_msg *)
       std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::begin
                 ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)
                  in_stack_fffffffffffffd68);
  local_68 = (common_chat_msg *)
             std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::end
                       ((vector<common_chat_msg,_std::allocator<common_chat_msg>_> *)
                        in_stack_fffffffffffffd68);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_common_chat_msg_*,_std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_common_chat_msg_*,_std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>_>
                             *)in_stack_fffffffffffffd68), bVar2) {
    local_70 = __gnu_cxx::
               __normal_iterator<const_common_chat_msg_*,_std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>_>
               ::operator*(&local_60);
    std::__cxx11::string::string(local_90,(string *)&local_70->content);
    local_a8 = &local_70->content_parts;
    local_b0._M_current =
         (common_chat_msg_content_part *)
         std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
         begin((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                *)in_stack_fffffffffffffd68);
    local_b8 = (common_chat_msg_content_part *)
               std::
               vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>::
               end((vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                    *)in_stack_fffffffffffffd68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_common_chat_msg_content_part_*,_std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>_>
                               *)in_stack_fffffffffffffd70,
                              (__normal_iterator<const_common_chat_msg_content_part_*,_std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>_>
                               *)in_stack_fffffffffffffd68), bVar2) {
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_common_chat_msg_content_part_*,_std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>_>
                 ::operator*(&local_b0);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      if (bVar2) {
        if (-1 < common_log_verbosity_thold) {
          log = common_log_main();
          uVar6 = std::__cxx11::string::c_str();
          common_log_add(log,GGML_LOG_LEVEL_WARN,"Ignoring non-text content part: %s\n",uVar6);
        }
      }
      else {
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          std::__cxx11::string::operator+=(local_90,"\n");
        }
        std::__cxx11::string::operator+=(local_90,(string *)&local_c0->text);
      }
      __gnu_cxx::
      __normal_iterator<const_common_chat_msg_content_part_*,_std::vector<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>_>
      ::operator++(&local_b0);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_90);
    __gnu_cxx::
    __normal_iterator<const_common_chat_msg_*,_std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>_>
    ::operator++(&local_60);
  }
  local_c8 = 0;
  while( true ) {
    uVar10 = local_c8;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_50);
    force_gbnf = (undefined1)((ulong)in_stack_fffffffffffffdc0 >> 0x38);
    if (sVar3 <= uVar10) break;
    local_d0 = std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::operator[]
                         (local_18,local_c8);
    local_d8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_50,local_c8);
    local_e8 = std::__cxx11::string::c_str();
    local_e0 = std::__cxx11::string::c_str();
    std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::push_back
              ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    lVar4 = std::__cxx11::string::size();
    lVar5 = std::__cxx11::string::size();
    lVar4 = lVar4 + lVar5;
    auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar11._0_8_ = lVar4;
    auVar11._12_4_ = 0x45300000;
    local_1c = (int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 1.25 +
                    (double)local_1c);
    local_c8 = local_c8 + 1;
  }
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::allocator<char>::~allocator(&local_101);
  this = std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::
         operator->((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
                    0x24648b);
  local_110 = minja::chat_template::source_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::c_str();
  plVar7 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::data
                     ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)0x2464c5);
  sVar3 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::size(&local_38);
  bVar1 = *(byte *)&local_18[3].
                    super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x24650a);
  sVar9 = std::vector<char,_std::allocator<char>_>::size(&local_100);
  local_114 = llama_chat_apply_template(uVar6,plVar7,sVar3,bVar1 & 1,pcVar8,sVar9 & 0xffffffff);
  if (local_114 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this custom template is not supported");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = (ulong)local_114;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_100);
  if (sVar3 < uVar10) {
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    uVar6 = std::__cxx11::string::c_str();
    plVar7 = std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::data
                       ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)0x246687)
    ;
    in_stack_fffffffffffffdc8 =
         (json *)std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::size
                           (&local_38);
    bVar1 = *(byte *)&local_18[3].
                      super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x2466bd);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_100);
    local_114 = llama_chat_apply_template
                          (uVar6,plVar7,in_stack_fffffffffffffdc8,bVar1 & 1,pcVar8,
                           sVar3 & 0xffffffff);
    force_gbnf = (undefined1)((ulong)plVar7 >> 0x38);
  }
  local_115 = 0;
  common_chat_params::common_chat_params(in_stack_fffffffffffffd70);
  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x246722);
  uVar10 = (ulong)local_114;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,pcVar8,uVar10,&local_139);
  std::__cxx11::string::operator=((string *)&in_RDI->prompt,local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    this_01 = &local_18[2].super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    in_stack_fffffffffffffd84 = 0;
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                *)this_01,in_stack_fffffffffffffd68);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f,
               (bool)in_stack_fffffffffffffe9e);
    json_schema_to_grammar(in_stack_fffffffffffffdc8,(bool)force_gbnf);
    std::__cxx11::string::operator=((string *)&in_RDI->grammar,(string *)&stack0xfffffffffffffea0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)this_01);
    std::
    function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
    ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_3::detail::parse_event_t,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                 *)0x246857);
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI->grammar,(string *)(local_18 + 1));
  }
  local_115 = 1;
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::~vector
            ((vector<llama_chat_message,_std::allocator<llama_chat_message>_> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  return in_RDI;
}

Assistant:

static common_chat_params common_chat_templates_apply_legacy(
    const struct common_chat_templates * tmpls,
    const struct common_chat_templates_inputs & inputs)
{
    int alloc_size = 0;
    std::vector<llama_chat_message> chat;
    std::vector<std::string> contents;
    for (const auto & msg : inputs.messages) {
        auto content = msg.content;
        for (const auto & part : msg.content_parts) {
            if (part.type != "text") {
                LOG_WRN("Ignoring non-text content part: %s\n", part.type.c_str());
                continue;
            }
            if (!content.empty()) {
                content += "\n";;
            }
            content += part.text;
        }
        contents.emplace_back(std::move(content));
    }
    for (size_t i = 0; i < contents.size(); ++i) {
        const auto & msg = inputs.messages[i];
        const auto & content = contents[i];
        chat.push_back({msg.role.c_str(), content.c_str()});
        alloc_size += (msg.role.size() + content.size()) * 1.25;
    }

    std::vector<char> buf(alloc_size);

    // run the first time to get the total output length
    const auto & src = tmpls->template_default->source();
    int32_t res = llama_chat_apply_template(src.c_str(), chat.data(), chat.size(), inputs.add_generation_prompt, buf.data(), buf.size());

    // error: chat template is not supported
    if (res < 0) {
        // if the custom "tmpl" is not supported, we throw an error
        // this is a bit redundant (for good), since we're not sure if user validated the custom template with llama_chat_verify_template()
        throw std::runtime_error("this custom template is not supported");
    }

    // if it turns out that our buffer is too small, we resize it
    if ((size_t) res > buf.size()) {
        buf.resize(res);
        res = llama_chat_apply_template(src.c_str(), chat.data(), chat.size(), inputs.add_generation_prompt, buf.data(), buf.size());
    }

    common_chat_params params;
    params.prompt = std::string(buf.data(), res);
    if (!inputs.json_schema.empty()) {
        params.grammar = json_schema_to_grammar(json::parse(inputs.json_schema));
    } else {
        params.grammar = inputs.grammar;
    }
    return params;
}